

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O2

bool __thiscall
RTIMUHal::HALWrite(RTIMUHal *this,uchar slaveAddr,uchar regAddr,uchar length,uchar *data,
                  char *errorMsg)

{
  bool bVar1;
  uchar regAddr_local;
  char *local_140;
  uchar txBuff [256];
  
  regAddr_local = regAddr;
  if (this->m_busIsI2C == true) {
    bVar1 = I2CSelectSlave(this,slaveAddr,errorMsg);
    if (!bVar1) {
      return false;
    }
    local_140 = "I2C";
  }
  else {
    local_140 = "SPI";
  }
  if (length == '\0') {
    bVar1 = ifWrite(this,&regAddr_local,'\x01');
    if (bVar1) {
      return true;
    }
    if (*errorMsg != '\0') {
      fprintf(_stderr,"%s write of regAddr failed (nothing written) - %s\n",local_140,errorMsg);
      return false;
    }
  }
  else {
    txBuff[0] = regAddr;
    memcpy(txBuff + 1,data,(ulong)length);
    bVar1 = ifWrite(this,txBuff,length + '\x01');
    if ((uint)length <= (uint)bVar1) {
      return true;
    }
    if (*errorMsg != '\0') {
      fprintf(_stderr,"%s data write of %d bytes failed, only %d written - %s\n",local_140,
              (ulong)(uint)length,(ulong)bVar1,errorMsg);
      return false;
    }
  }
  return false;
}

Assistant:

bool RTIMUHal::HALWrite(unsigned char slaveAddr, unsigned char regAddr,
                   unsigned char length, unsigned char const *data, const char *errorMsg)
{
    int result;
    unsigned char txBuff[MAX_WRITE_LEN + 1];
    char *ifType;

    if (m_busIsI2C) {
        if (!I2CSelectSlave(slaveAddr, errorMsg))
            return false;
        ifType = (char *)"I2C";
    } else {
        ifType = (char *)"SPI";
    }

    if (length == 0) {
        result = ifWrite(&regAddr, 1);

        if (result < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("%s write of regAddr failed - %s\n", ifType, errorMsg);
            return false;
        } else if (result != 1) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("%s write of regAddr failed (nothing written) - %s\n", ifType, errorMsg);
            return false;
        }
    } else {
        txBuff[0] = regAddr;
        memcpy(txBuff + 1, data, length);

        result = ifWrite(txBuff, length + 1);

        if (result < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR3("%s data write of %d bytes failed - %s\n", ifType, length, errorMsg);
            return false;
        } else if (result < (int)length) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR4("%s data write of %d bytes failed, only %d written - %s\n", ifType, length, result, errorMsg);
            return false;
        }
    }
    return true;
}